

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

Chainstate * __thiscall
ChainstateManager::InitializeChainstate(ChainstateManager *this,CTxMemPool *mempool)

{
  _Head_base<0UL,_Chainstate_*,_false> _Var1;
  __uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_> __p;
  long in_FS_OFFSET;
  __uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_> local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = mempool;
  if ((this->m_ibd_chainstate)._M_t.
      super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
      super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
      super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0) {
    __assert_fail("!m_ibd_chainstate",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x15e4,"Chainstate &ChainstateManager::InitializeChainstate(CTxMemPool *)");
  }
  if (this->m_active_chainstate == (Chainstate *)0x0) {
    std::make_unique<Chainstate,CTxMemPool*&,node::BlockManager&,ChainstateManager&>
              ((CTxMemPool **)&local_28,(BlockManager *)&stack0xffffffffffffffe0,
               (ChainstateManager *)&this->m_blockman);
    __p._M_t.super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
    super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl =
         local_28._M_t.super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
         super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
    local_28._M_t.super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
    super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl =
         (tuple<Chainstate_*,_std::default_delete<Chainstate>_>)
         (_Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>)0x0;
    std::__uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>::reset
              ((__uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_> *)this,
               (pointer)__p._M_t.
                        super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                        super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl);
    std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::~unique_ptr
              ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)&local_28);
    _Var1._M_head_impl =
         (this->m_ibd_chainstate)._M_t.
         super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
         super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
         super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
    this->m_active_chainstate = _Var1._M_head_impl;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return _Var1._M_head_impl;
    }
    __stack_chk_fail();
  }
  __assert_fail("!m_active_chainstate",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                ,0x15e5,"Chainstate &ChainstateManager::InitializeChainstate(CTxMemPool *)");
}

Assistant:

Chainstate& ChainstateManager::InitializeChainstate(CTxMemPool* mempool)
{
    AssertLockHeld(::cs_main);
    assert(!m_ibd_chainstate);
    assert(!m_active_chainstate);

    m_ibd_chainstate = std::make_unique<Chainstate>(mempool, m_blockman, *this);
    m_active_chainstate = m_ibd_chainstate.get();
    return *m_active_chainstate;
}